

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O3

void ProcessGestureEvent(GestureEvent event)

{
  anon_struct_16_3_87c46a66_for_Pinch aVar1;
  long lVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  timespec now;
  int in_stack_00000010;
  Vector2 in_stack_00000020;
  Vector2 in_stack_00000028;
  timespec local_28;
  float local_14;
  
  aVar1 = GESTURES.Pinch;
  GESTURES.Touch.pointCount = now.tv_nsec._4_4_;
  fVar12 = in_stack_00000020.x;
  fVar15 = in_stack_00000020.y;
  if (1 < now.tv_nsec._4_4_) {
    if ((int)now.tv_nsec == 0) {
      GESTURES.current = 0;
      GESTURES.Touch.pointCount = 0;
      GESTURES.Pinch = (anon_struct_16_3_87c46a66_for_Pinch)ZEXT816(0);
      return;
    }
    fVar14 = in_stack_00000028.x;
    fVar16 = in_stack_00000028.y;
    if ((int)now.tv_nsec == 2) {
      fVar18 = GESTURES.Touch.moveDownPositionB.x;
      fVar19 = GESTURES.Touch.moveDownPositionB.y;
      fVar13 = GESTURES.Touch.moveDownPositionA.x;
      fVar20 = GESTURES.Touch.moveDownPositionA.y;
      fVar3 = fVar13 - fVar18;
      fVar17 = fVar20 - fVar19;
      fVar3 = SQRT(fVar3 * fVar3 + fVar17 * fVar17);
      GESTURES.Pinch.distance = fVar3;
      aVar1 = GESTURES.Pinch;
      GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
      GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;
      GESTURES.Touch.moveDownPositionA = in_stack_00000020;
      GESTURES.Touch.moveDownPositionB = in_stack_00000028;
      GESTURES.Pinch.vector.y = fVar16 - fVar15;
      GESTURES.Pinch.vector.x = fVar14 - fVar12;
      GESTURES.Pinch._8_8_ = aVar1._8_8_;
      fVar13 = fVar13 - fVar12;
      fVar20 = fVar20 - fVar15;
      if ((0.005 <= SQRT(fVar13 * fVar13 + fVar20 * fVar20)) ||
         (fVar18 = fVar18 - fVar14, fVar19 = fVar19 - fVar16,
         0.005 <= SQRT(fVar18 * fVar18 + fVar19 * fVar19))) {
        if (fVar3 <= SQRT((fVar12 - fVar14) * (fVar12 - fVar14) +
                          (fVar15 - fVar16) * (fVar15 - fVar16))) {
          GESTURES.current = 0x200;
        }
        else {
          GESTURES.current = 0x100;
        }
      }
      else {
        GESTURES.current = 4;
        clock_gettime(1,&local_28);
        local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
        auVar8._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
        auVar8._0_8_ = local_28.tv_nsec;
        auVar8._12_4_ = 0x45300000;
        GESTURES.Hold.timeDuration =
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
        fVar12 = GESTURES.Touch.moveDownPositionA.x;
        fVar14 = GESTURES.Touch.moveDownPositionB.x;
        fVar16 = GESTURES.Touch.moveDownPositionB.y;
        fVar15 = GESTURES.Touch.moveDownPositionA.y;
      }
      fVar12 = atan2f(fVar16 - fVar15,fVar14 - fVar12);
      fVar12 = fVar12 * 57.295776;
      GESTURES.Pinch.angle =
           360.0 - (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar12 |
                          (uint)(fVar12 + 360.0) & -(uint)(fVar12 < 0.0));
      return;
    }
    if ((int)now.tv_nsec != 1) {
      return;
    }
    GESTURES.Touch.downPositionA = in_stack_00000020;
    GESTURES.Touch.downPositionB = in_stack_00000028;
    GESTURES.Pinch.vector.y = fVar16 - fVar15;
    GESTURES.Pinch.vector.x = fVar14 - fVar12;
    GESTURES.Pinch._8_8_ = aVar1._8_8_;
    GESTURES.current = 4;
    clock_gettime(1,&local_28);
    local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    auVar5._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
    auVar5._0_8_ = local_28.tv_nsec;
    auVar5._12_4_ = 0x45300000;
    GESTURES.Hold.timeDuration =
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
    return;
  }
  if ((int)now.tv_nsec == 0) {
    if (GESTURES.current == 8) {
      GESTURES.Touch.upPosition = in_stack_00000020;
    }
    fVar12 = GESTURES.Touch.downPositionA.x - GESTURES.Touch.upPosition.x;
    fVar15 = GESTURES.Touch.downPositionA.y - GESTURES.Touch.upPosition.y;
    local_14 = SQRT(fVar12 * fVar12 + fVar15 * fVar15);
    GESTURES.Drag.distance = local_14;
    clock_gettime(1,&local_28);
    local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    auVar10._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
    auVar10._0_8_ = local_28.tv_nsec;
    auVar10._12_4_ = 0x45300000;
    GESTURES.Drag.intensity =
         local_14 /
         (float)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) /
                 1000000.0 - GESTURES.Swipe.timeDuration);
    GESTURES.Swipe.start = false;
    if ((GESTURES.Drag.intensity <= 0.0005) || (GESTURES.Touch.firstId != in_stack_00000010)) {
      GESTURES.Drag.intensity = 0.0;
      GESTURES.Drag.angle = 0.0;
      GESTURES.Drag.distance = 0.0;
      GESTURES.current = 0;
    }
    else {
      fVar12 = atan2f(GESTURES.Touch.upPosition.y - GESTURES.Touch.downPositionA.y,
                      GESTURES.Touch.upPosition.x - GESTURES.Touch.downPositionA.x);
      fVar12 = fVar12 * 57.295776;
      GESTURES.Drag.angle =
           360.0 - (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar12 |
                          (uint)(fVar12 + 360.0) & -(uint)(fVar12 < 0.0));
      GESTURES.current = 0x10;
      if ((((30.0 <= GESTURES.Drag.angle) && (GESTURES.Drag.angle <= 330.0)) &&
          ((GESTURES.Drag.angle <= 30.0 || (GESTURES.current = 0x40, 120.0 <= GESTURES.Drag.angle)))
          ) && ((GESTURES.Drag.angle <= 120.0 ||
                (GESTURES.current = 0x20, 210.0 <= GESTURES.Drag.angle)))) {
        GESTURES.current =
             (-(uint)(210.0 < GESTURES.Drag.angle && GESTURES.Drag.angle < 300.0) & 1) << 7;
      }
    }
    GESTURES.Touch.pointCount = 0;
    GESTURES.Touch.downDragPosition.x = 0.0;
    GESTURES.Touch.downDragPosition.y = 0.0;
    return;
  }
  if ((int)now.tv_nsec == 2) {
    if (GESTURES.current == 8) {
      clock_gettime(1,&local_28);
      lVar2 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar6._0_8_ = lVar2;
      auVar6._12_4_ = 0x45300000;
      GESTURES.Touch.eventTime =
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0;
    }
    if (GESTURES.Swipe.start == false) {
      clock_gettime(1,&local_28);
      lVar2 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
      auVar7._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar7._0_8_ = lVar2;
      auVar7._12_4_ = 0x45300000;
      GESTURES.Swipe.timeDuration =
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0;
      GESTURES.Swipe.start = true;
    }
    GESTURES.Touch.moveDownPositionA = in_stack_00000020;
    if (GESTURES.current == 4) {
      if (GESTURES.Hold.resetRequired != false) {
        GESTURES.Touch.downPositionA = in_stack_00000020;
      }
      GESTURES.Hold.resetRequired = false;
      fVar12 = GESTURES.Touch.downPositionA.x - fVar12;
      fVar15 = GESTURES.Touch.downPositionA.y - fVar15;
      if (0.015 <= SQRT(fVar12 * fVar12 + fVar15 * fVar15)) {
        clock_gettime(1,&local_28);
        local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
        auVar11._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
        auVar11._0_8_ = local_28.tv_nsec;
        auVar11._12_4_ = 0x45300000;
        GESTURES.Touch.eventTime =
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
        GESTURES.current = 8;
      }
    }
    GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
    GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
    return;
  }
  if ((int)now.tv_nsec != 1) {
    return;
  }
  if (0 < GESTURES.Touch.tapCounter && GESTURES.current == 0) {
    GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1;
    clock_gettime(1,&local_28);
    lVar2 = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    if ((((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 1000000.0 -
         GESTURES.Touch.eventTime < 300.0) &&
       (fVar12 = GESTURES.Touch.downPositionA.x - fVar12,
       fVar15 = GESTURES.Touch.downPositionA.y - fVar15,
       SQRT(fVar12 * fVar12 + fVar15 * fVar15) < 0.03)) {
      GESTURES.current = 2;
      GESTURES.Touch.tapCounter = 0;
      goto LAB_0011adf3;
    }
  }
  GESTURES.Touch.tapCounter = 1;
  GESTURES.current = 1;
LAB_0011adf3:
  GESTURES.Touch.downPositionA = in_stack_00000020;
  GESTURES.Touch.downDragPosition = in_stack_00000020;
  GESTURES.Touch.upPosition = in_stack_00000020;
  clock_gettime(1,&local_28);
  local_28.tv_nsec = local_28.tv_sec * 1000000000 + local_28.tv_nsec;
  auVar9._8_4_ = (int)((ulong)local_28.tv_nsec >> 0x20);
  auVar9._0_8_ = local_28.tv_nsec;
  auVar9._12_4_ = 0x45300000;
  GESTURES.Drag.vector.x = 0.0;
  GESTURES.Drag.vector.y = 0.0;
  GESTURES.Touch.eventTime =
       ((auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_28.tv_nsec) - 4503599627370496.0)) / 1000000.0;
  GESTURES.Touch.firstId = in_stack_00000010;
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount < 2)
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((GetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (Vector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = GetCurrentTime();

            GESTURES.Touch.firstId = event.pointerId[0];

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_UP)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependend on the resolution of the screen
            GESTURES.Drag.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((GetCurrentTime() - GESTURES.Swipe.timeDuration));

            GESTURES.Swipe.start = false;

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.Touch.firstId == event.pointerId[0]))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - Vector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;        // Right
                else if ((GESTURES.Drag.angle > 30) && (GESTURES.Drag.angle < 120)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 120) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;   // Left
                else if ((GESTURES.Drag.angle > 210) && (GESTURES.Drag.angle < 300)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.eventTime = GetCurrentTime();

            if (!GESTURES.Swipe.start)
            {
                GESTURES.Swipe.timeDuration = GetCurrentTime();
                GESTURES.Swipe.start = true;
            }

            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if (Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_DRAG)
                {
                    GESTURES.Touch.eventTime = GetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else    // Two touch points
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            //GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = GetCurrentTime();
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
            GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (Vector2Distance(GESTURES.Touch.downPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ((Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) - GESTURES.Pinch.distance) < 0) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = GetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - Vector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
}